

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::Compiler::flush_all_atomic_capable_variables(Compiler *this)

{
  uint *puVar1;
  SPIRVariable *var;
  uint global;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  Compiler *this_local;
  
  __end1 = VectorView<unsigned_int>::begin(&(this->global_variables).super_VectorView<unsigned_int>)
  ;
  puVar1 = VectorView<unsigned_int>::end(&(this->global_variables).super_VectorView<unsigned_int>);
  for (; __end1 != puVar1; __end1 = __end1 + 1) {
    var = get<diligent_spirv_cross::SPIRVariable>(this,*__end1);
    flush_dependees(this,var);
  }
  flush_all_aliased_variables(this);
  return;
}

Assistant:

void Compiler::flush_all_atomic_capable_variables()
{
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));
	flush_all_aliased_variables();
}